

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

void __thiscall Gecko::Graph::update(Graph *this,Index i,Index j,Float w,Float b)

{
  uint uVar1;
  uint uVar2;
  pointer pNVar3;
  pointer pfVar4;
  uint uVar5;
  ulong uVar6;
  
  pNVar3 = (this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pNVar3[i - 1].arc;
  uVar6 = (ulong)uVar1;
  uVar2 = pNVar3[i].arc;
  uVar5 = 0;
  if (uVar1 < uVar2) {
    do {
      if ((this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] == j) {
        uVar5 = (uint)uVar6;
        break;
      }
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  if (uVar5 == 0) {
    insert_arc(this,i,j,w,b);
    return;
  }
  pfVar4 = (this->weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar4[uVar5] = w + pfVar4[uVar5];
  pfVar4 = (this->bond).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar4[uVar5] = b + pfVar4[uVar5];
  return;
}

Assistant:

Arc::Index node_begin(Node::Index i) const { return node[i - 1].arc; }